

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Configuration.cpp
# Opt level: O0

void __thiscall aeron::archive::Configuration::Configuration(Configuration *this,string *filename)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  long lVar4;
  int32_t local_348;
  allocator local_341;
  string local_340;
  int32_t local_320;
  allocator local_319;
  string local_318;
  bool local_2f2;
  allocator local_2f1;
  string local_2f0;
  int32_t local_2d0;
  allocator local_2c9;
  string local_2c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8;
  allocator local_281;
  string local_280;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  int32_t local_240;
  allocator local_239;
  string local_238;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  allocator local_1f1;
  string local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  int32_t local_1b0;
  allocator local_1a9;
  string local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  allocator local_161;
  string local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  int32_t local_120;
  allocator local_119;
  string local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  allocator local_d1;
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  int64_t local_90;
  allocator local_81;
  string local_80;
  undefined1 local_50 [8];
  PropertiesReader pr;
  string *filename_local;
  Configuration *this_local;
  
  pr.properties_._M_h._M_single_bucket = (__node_base_ptr)filename;
  std::__cxx11::string::string((string *)&this->controlChannel);
  std::__cxx11::string::string((string *)&this->localControlChannel);
  std::__cxx11::string::string((string *)&this->controlResponseChannel);
  std::__cxx11::string::string((string *)&this->recordingEventsChannel);
  util::PropertiesReader::PropertiesReader
            ((PropertiesReader *)local_50,(string *)pr.properties_._M_h._M_single_bucket,true);
  pcVar3 = anon_unknown.dwarf_61d77::MessageTimeout::key();
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_80,pcVar3,&local_81);
  local_90 = anon_unknown.dwarf_61d77::MessageTimeout::defaultValue();
  lVar4 = util::PropertiesReader::get<long>((PropertiesReader *)local_50,&local_80,&local_90);
  this->messageTimeoutNs = lVar4;
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator((allocator<char> *)&local_81);
  pcVar3 = anon_unknown.dwarf_61d77::ControlChannel::key();
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_d0,pcVar3,&local_d1);
  (anonymous_namespace)::ControlChannel::defaultValue_abi_cxx11_();
  util::PropertiesReader::get<std::__cxx11::string>
            (&local_b0,(PropertiesReader *)local_50,&local_d0,&local_f8);
  std::__cxx11::string::operator=((string *)&this->controlChannel,(string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::~string((string *)&local_d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_d1);
  pcVar3 = anon_unknown.dwarf_61d77::ControlStreamId::key();
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_118,pcVar3,&local_119);
  local_120 = anon_unknown.dwarf_61d77::ControlStreamId::defaultValue();
  iVar2 = util::PropertiesReader::get<int>((PropertiesReader *)local_50,&local_118,&local_120);
  this->controlStreamId = iVar2;
  std::__cxx11::string::~string((string *)&local_118);
  std::allocator<char>::~allocator((allocator<char> *)&local_119);
  pcVar3 = anon_unknown.dwarf_61d77::LocalControlChannel::key();
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_160,pcVar3,&local_161);
  (anonymous_namespace)::LocalControlChannel::defaultValue_abi_cxx11_();
  util::PropertiesReader::get<std::__cxx11::string>
            (&local_140,(PropertiesReader *)local_50,&local_160,&local_188);
  std::__cxx11::string::operator=((string *)&this->localControlChannel,(string *)&local_140);
  std::__cxx11::string::~string((string *)&local_140);
  std::__cxx11::string::~string((string *)&local_188);
  std::__cxx11::string::~string((string *)&local_160);
  std::allocator<char>::~allocator((allocator<char> *)&local_161);
  pcVar3 = anon_unknown.dwarf_61d77::LocalControlStreamId::key();
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1a8,pcVar3,&local_1a9);
  local_1b0 = anon_unknown.dwarf_61d77::LocalControlStreamId::defaultValue();
  iVar2 = util::PropertiesReader::get<int>((PropertiesReader *)local_50,&local_1a8,&local_1b0);
  this->localControlStreamId = iVar2;
  std::__cxx11::string::~string((string *)&local_1a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a9);
  pcVar3 = anon_unknown.dwarf_61d77::ControlResponseChannel::key();
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1f0,pcVar3,&local_1f1);
  (anonymous_namespace)::ControlResponseChannel::defaultValue_abi_cxx11_();
  util::PropertiesReader::get<std::__cxx11::string>
            (&local_1d0,(PropertiesReader *)local_50,&local_1f0,&local_218);
  std::__cxx11::string::operator=((string *)&this->controlResponseChannel,(string *)&local_1d0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::string::~string((string *)&local_218);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1f1);
  pcVar3 = anon_unknown.dwarf_61d77::ControlResponseStreamId::key();
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_238,pcVar3,&local_239);
  local_240 = anon_unknown.dwarf_61d77::ControlResponseStreamId::defaultValue();
  iVar2 = util::PropertiesReader::get<int>((PropertiesReader *)local_50,&local_238,&local_240);
  this->controlResponseStreamId = iVar2;
  std::__cxx11::string::~string((string *)&local_238);
  std::allocator<char>::~allocator((allocator<char> *)&local_239);
  pcVar3 = anon_unknown.dwarf_61d77::RecordingEventsChannel::key();
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_280,pcVar3,&local_281);
  (anonymous_namespace)::RecordingEventsChannel::defaultValue_abi_cxx11_();
  util::PropertiesReader::get<std::__cxx11::string>
            (&local_260,(PropertiesReader *)local_50,&local_280,&local_2a8);
  std::__cxx11::string::operator=((string *)&this->recordingEventsChannel,(string *)&local_260);
  std::__cxx11::string::~string((string *)&local_260);
  std::__cxx11::string::~string((string *)&local_2a8);
  std::__cxx11::string::~string((string *)&local_280);
  std::allocator<char>::~allocator((allocator<char> *)&local_281);
  pcVar3 = anon_unknown.dwarf_61d77::RecordingEventsStreamId::key();
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2c8,pcVar3,&local_2c9);
  local_2d0 = anon_unknown.dwarf_61d77::RecordingEventsStreamId::defaultValue();
  iVar2 = util::PropertiesReader::get<int>((PropertiesReader *)local_50,&local_2c8,&local_2d0);
  this->recordingEventsStreamId = iVar2;
  std::__cxx11::string::~string((string *)&local_2c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2c9);
  pcVar3 = anon_unknown.dwarf_61d77::ControlTermBufferSparse::key();
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2f0,pcVar3,&local_2f1);
  local_2f2 = anon_unknown.dwarf_61d77::ControlTermBufferSparse::defaultValue();
  bVar1 = util::PropertiesReader::get<bool>((PropertiesReader *)local_50,&local_2f0,&local_2f2);
  this->controlTermBufferSparse = bVar1;
  std::__cxx11::string::~string((string *)&local_2f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2f1);
  pcVar3 = anon_unknown.dwarf_61d77::ControlTermBufferLength::key();
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_318,pcVar3,&local_319);
  local_320 = anon_unknown.dwarf_61d77::ControlTermBufferLength::defaultValue();
  iVar2 = util::PropertiesReader::get<int>((PropertiesReader *)local_50,&local_318,&local_320);
  this->controlTermBufferLength = iVar2;
  std::__cxx11::string::~string((string *)&local_318);
  std::allocator<char>::~allocator((allocator<char> *)&local_319);
  pcVar3 = anon_unknown.dwarf_61d77::ControlMtuLength::key();
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_340,pcVar3,&local_341);
  local_348 = anon_unknown.dwarf_61d77::ControlMtuLength::defaultValue();
  iVar2 = util::PropertiesReader::get<int>((PropertiesReader *)local_50,&local_340,&local_348);
  this->controlMtuLength = iVar2;
  std::__cxx11::string::~string((string *)&local_340);
  std::allocator<char>::~allocator((allocator<char> *)&local_341);
  util::PropertiesReader::~PropertiesReader((PropertiesReader *)local_50);
  return;
}

Assistant:

Configuration::Configuration(const std::string& filename) {
    util::PropertiesReader pr(filename, true);

    messageTimeoutNs = pr.get(MessageTimeout::key(), MessageTimeout::defaultValue());
    controlChannel = pr.get(ControlChannel::key(), ControlChannel::defaultValue());
    controlStreamId = pr.get(ControlStreamId::key(), ControlStreamId::defaultValue());
    localControlChannel = pr.get(LocalControlChannel::key(), LocalControlChannel::defaultValue());
    localControlStreamId = pr.get(LocalControlStreamId::key(), LocalControlStreamId::defaultValue());
    controlResponseChannel = pr.get(ControlResponseChannel::key(), ControlResponseChannel::defaultValue());
    controlResponseStreamId = pr.get(ControlResponseStreamId::key(), ControlResponseStreamId::defaultValue());
    recordingEventsChannel = pr.get(RecordingEventsChannel::key(), RecordingEventsChannel::defaultValue());
    recordingEventsStreamId = pr.get(RecordingEventsStreamId::key(), RecordingEventsStreamId::defaultValue());
    controlTermBufferSparse = pr.get(ControlTermBufferSparse::key(), ControlTermBufferSparse::defaultValue());
    controlTermBufferLength = pr.get(ControlTermBufferLength::key(), ControlTermBufferLength::defaultValue());
    controlMtuLength = pr.get(ControlMtuLength::key(), ControlMtuLength::defaultValue());
}